

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O2

void lua_gettable(lua_State *L,int idx)

{
  TValue *t;
  
  t = index2adr(L,idx);
  if (t != &luaO_nilobject_) {
    luaV_gettable(L,t,L->top + -1,L->top + -1);
    return;
  }
  __assert_fail("(t) != (&luaO_nilobject_)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cuberite[P]lua/src/lapi.cpp"
                ,0x21a,"void lua_gettable(lua_State *, int)");
}

Assistant:

LUA_API void lua_gettable (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  t = index2adr(L, idx);
  api_checkvalidindex(L, t);
  luaV_gettable(L, t, L->top - 1, L->top - 1);
  lua_unlock(L);
}